

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec.hpp
# Opt level: O0

void __thiscall toml::spec::spec(spec *this,semantic_version *semver)

{
  undefined8 uVar1;
  bool bVar2;
  undefined8 *in_RSI;
  semantic_version *in_RDI;
  semantic_version *in_stack_ffffffffffffff88;
  semantic_version local_64;
  semantic_version local_58;
  semantic_version local_4c;
  semantic_version local_40;
  semantic_version local_34;
  semantic_version local_28;
  semantic_version local_1c [2];
  
  uVar1 = *in_RSI;
  in_RDI->major = (int)uVar1;
  in_RDI->minor = (int)((ulong)uVar1 >> 0x20);
  in_RDI->patch = *(uint32_t *)(in_RSI + 1);
  semantic_version::semantic_version(local_1c,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)&in_RDI[1].major = bVar2;
  semantic_version::semantic_version(&local_28,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)((long)&in_RDI[1].major + 1) = bVar2;
  semantic_version::semantic_version(&local_34,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)((long)&in_RDI[1].major + 2) = bVar2;
  semantic_version::semantic_version(&local_40,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)((long)&in_RDI[1].major + 3) = bVar2;
  semantic_version::semantic_version(&local_4c,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)&in_RDI[1].minor = bVar2;
  semantic_version::semantic_version(&local_58,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)((long)&in_RDI[1].minor + 1) = bVar2;
  semantic_version::semantic_version(&local_64,1,1,0);
  bVar2 = operator<=(in_RDI,in_stack_ffffffffffffff88);
  *(bool *)((long)&in_RDI[1].minor + 2) = bVar2;
  *(undefined1 *)((long)&in_RDI[1].minor + 3) = 0;
  *(undefined1 *)&in_RDI[1].patch = 0;
  *(undefined1 *)((long)&in_RDI[1].patch + 1) = 0;
  return;
}

Assistant:

constexpr explicit spec(const semantic_version& semver) noexcept
        : version{semver},
          v1_1_0_allow_control_characters_in_comments {semantic_version{1, 1, 0} <= semver},
          v1_1_0_allow_newlines_in_inline_tables      {semantic_version{1, 1, 0} <= semver},
          v1_1_0_allow_trailing_comma_in_inline_tables{semantic_version{1, 1, 0} <= semver},
          v1_1_0_allow_non_english_in_bare_keys       {semantic_version{1, 1, 0} <= semver},
          v1_1_0_add_escape_sequence_e                {semantic_version{1, 1, 0} <= semver},
          v1_1_0_add_escape_sequence_x                {semantic_version{1, 1, 0} <= semver},
          v1_1_0_make_seconds_optional                {semantic_version{1, 1, 0} <= semver},
          ext_hex_float {false},
          ext_num_suffix{false},
          ext_null_value{false}
    {}